

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O3

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  short sVar1;
  int iVar2;
  jpeg_entropy_encoder *pjVar3;
  JBLOCKROW paJVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  _func_void_j_compress_ptr *p_Var15;
  code *pcVar16;
  _func_void_j_compress_ptr *st;
  bool bVar17;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar7 = *(uint *)&pjVar3[4].start_pass;
    if (uVar7 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar3[4].start_pass + 4));
      uVar7 = cinfo->restart_interval;
      *(uint *)((long)&pjVar3[4].start_pass + 4) =
           *(int *)((long)&pjVar3[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar3[4].start_pass = uVar7 - 1;
  }
  paJVar4 = *MCU_data;
  uVar7 = cinfo->Se;
  uVar10 = (ulong)uVar7;
  uVar6 = (long)(int)uVar7;
  if (0 < (long)(int)uVar7) {
    do {
      uVar10 = uVar6;
      sVar1 = (*paJVar4)[jpeg_natural_order[uVar10]];
      uVar9 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar9 = -uVar9;
      }
      if (uVar9 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_00111514;
      uVar6 = uVar10 - 1;
    } while (1 < (long)uVar10);
    uVar10 = 0;
  }
LAB_00111514:
  iVar2 = cinfo->cur_comp_info[0]->ac_tbl_no;
  iVar8 = cinfo->Ss;
  if (iVar8 <= (int)uVar10) {
LAB_00111542:
    p_Var15 = (&pjVar3[9].finish_pass)[iVar2];
    lVar12 = (long)(iVar8 * 3 + -3);
    arith_encode(cinfo,(uchar *)(p_Var15 + lVar12),0);
    piVar14 = jpeg_natural_order + iVar8;
    p_Var15 = p_Var15 + lVar12 + 1;
    iVar11 = iVar8;
    do {
      sVar1 = (*paJVar4)[*piVar14];
      uVar7 = (uint)sVar1;
      if (sVar1 < 0) {
        bVar5 = (byte)cinfo->Al & 0x1f;
        uVar9 = -uVar7 >> bVar5;
        if (-uVar7 >> bVar5 != 0) {
          iVar8 = 1;
          goto LAB_001115cc;
        }
      }
      else {
        bVar5 = (byte)cinfo->Al & 0x1f;
        uVar9 = uVar7 >> bVar5;
        if (uVar7 >> bVar5 != 0) goto LAB_001115c1;
      }
      arith_encode(cinfo,(uchar *)p_Var15,0);
      iVar11 = iVar11 + 1;
      piVar14 = piVar14 + 1;
      p_Var15 = p_Var15 + 3;
    } while( true );
  }
LAB_001116f9:
  if (iVar8 <= (int)uVar7) {
    arith_encode(cinfo,(uchar *)((&pjVar3[9].finish_pass)[iVar2] + (iVar8 * 3 + -3)),1);
  }
  return 1;
LAB_001115c1:
  iVar8 = 0;
LAB_001115cc:
  arith_encode(cinfo,(uchar *)p_Var15,1);
  arith_encode(cinfo,(uchar *)(pjVar3 + 0xf),iVar8);
  pcVar16 = p_Var15 + 1;
  uVar7 = uVar9 - 1;
  if ((uVar7 == 0) || (arith_encode(cinfo,(uchar *)pcVar16,1), uVar7 == 1)) {
    arith_encode(cinfo,(uchar *)pcVar16,0);
  }
  else {
    arith_encode(cinfo,(uchar *)pcVar16,1);
    lVar12 = 0xbd;
    if ((int)(uint)cinfo->arith_ac_K[iVar2] < iVar11) {
      lVar12 = 0xd9;
    }
    p_Var15 = (&pjVar3[9].finish_pass)[iVar2] + lVar12;
    if (uVar9 < 5) {
      arith_encode(cinfo,(uchar *)p_Var15,0);
      pcVar16 = p_Var15 + 0xe;
      uVar9 = 2;
    }
    else {
      uVar9 = 2;
      uVar13 = uVar7;
      do {
        st = p_Var15;
        arith_encode(cinfo,(uchar *)st,1);
        uVar9 = uVar9 * 2;
        bVar17 = 7 < uVar13;
        p_Var15 = st + 1;
        uVar13 = uVar13 >> 1;
      } while (bVar17);
      arith_encode(cinfo,(uchar *)(st + 1),0);
      if (uVar9 == 0) goto LAB_001116da;
      pcVar16 = st + 0xf;
    }
    do {
      uVar9 = (int)uVar9 >> 1;
      arith_encode(cinfo,(uchar *)pcVar16,(uint)((uVar9 & uVar7) != 0));
    } while (1 < uVar9);
  }
LAB_001116da:
  iVar8 = iVar11 + 1;
  if ((int)uVar10 <= iVar11) goto code_r0x001116ed;
  goto LAB_00111542;
code_r0x001116ed:
  uVar7 = cinfo->Se;
  iVar8 = iVar11 + 1;
  goto LAB_001116f9;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, temp2;
  register int nbits, r;
  int Sl = cinfo->Se - cinfo->Ss + 1;
  int Al = cinfo->Al;
  JCOEF values_unaligned[2 * DCTSIZE2 + 15];
  JCOEF *values;
  const JCOEF *cvalue;
  size_t zerobits;
  size_t bits[8 / SIZEOF_SIZE_T];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

#ifdef WITH_SIMD
  cvalue = values = (JCOEF *)PAD((JUINTPTR)values_unaligned, 16);
#else
  /* Not using SIMD, so alignment is not needed */
  cvalue = values = values_unaligned;
#endif

  /* Prepare data */
  entropy->AC_first_prepare(MCU_data[0][0], jpeg_natural_order + cinfo->Ss,
                            Sl, Al, values, bits);

  zerobits = bits[0];
#if SIZEOF_SIZE_T == 4
  zerobits |= bits[1];
#endif

  /* Emit any pending EOBRUN */
  if (zerobits && (entropy->EOBRUN > 0))
    emit_eobrun(entropy);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[0];
#endif

  /* Encode the AC coefficients per section G.1.2.2, fig. G.3 */

  ENCODE_COEFS_AC_FIRST((void)0;);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[1];
  if (zerobits) {
    int diff = ((values + DCTSIZE2 / 2) - cvalue);
    r = count_zeroes(&zerobits);
    r += diff;
    cvalue += r;
    goto first_iter_ac_first;
  }

  ENCODE_COEFS_AC_FIRST(first_iter_ac_first:);
#endif

  if (cvalue < (values + Sl)) { /* If there are trailing zeroes, */
    entropy->EOBRUN++;          /* count an EOB */
    if (entropy->EOBRUN == 0x7FFF)
      emit_eobrun(entropy);     /* force it out to avoid overflow */
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}